

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm_instr.c
# Opt level: O3

arm_instr_type_t get_arm_instr_type_hash(uint32_t hash)

{
  arm_instr_type_t aVar1;
  uint uVar2;
  
  aVar1 = SOFTWARE_INTERRUPT;
  if ((~hash & 0xf00) != 0) {
    uVar2 = hash & 0xe00;
    aVar1 = COPROCESSOR_DATA_TRANSFER;
    if (uVar2 != 0xc00) {
      if ((hash & 0xf01) == 0xe00) {
        return COPROCESSOR_DATA_OPERATION;
      }
      if ((hash & 0xf01) == 0xe01) {
        return COPROCESSOR_REGISTER_TRANSFER;
      }
      if (uVar2 == 0xa00) {
        return BRANCH;
      }
      if (uVar2 == 0x800) {
        return BLOCK_DATA_TRANSFER;
      }
      aVar1 = UNDEFINED;
      if ((hash & 0xe01) != 0x601) {
        aVar1 = SINGLE_DATA_TRANSFER;
        if (((((hash & 0xc00) != 0x400) && (aVar1 = BRANCH_EXCHANGE, (hash & 0xfff) != 0x121)) &&
            (aVar1 = MULTIPLY, (hash & 0xfcf) != 9)) &&
           ((aVar1 = MULTIPLY_LONG, (hash & 0xf8f) != 0x89 &&
            (aVar1 = SINGLE_DATA_SWAP, (hash & 0xfbf) != 0x109)))) {
          if ((hash & 0xe09) == 9) {
            aVar1 = UNDEFINED;
            if ((hash & 6) != 0) {
              aVar1 = HALFWORD_DT_IO - ((hash & 0x40) == 0);
            }
            return aVar1;
          }
          aVar1 = STATUS_TRANSFER;
          if (((hash & 0xd90) != 0x100) && (aVar1 = UNDEFINED, (hash & 0xc00) == 0)) {
            return (uint)((hash & 400) == 0x100) * 9;
          }
        }
      }
    }
  }
  return aVar1;
}

Assistant:

arm_instr_type_t get_arm_instr_type_hash(word hash) {
    if ((hash & 0b111100000000u) == 0b111100000000u) {
        return SOFTWARE_INTERRUPT;
    }
    if ((hash & 0b111000000000u) == 0b110000000000u) {
        return COPROCESSOR_DATA_TRANSFER;
    }
    if ((hash & 0b111100000001u) == 0b111000000000u) {
        return COPROCESSOR_DATA_OPERATION;
    }
    if ((hash & 0b111100000001u) == 0b111000000001u) {
        return COPROCESSOR_REGISTER_TRANSFER;
    }
    if ((hash & 0b111000000000u) == 0b101000000000u) {
        return BRANCH;
    }
    if ((hash & 0b111000000000u) == 0b100000000000u) {
        return BLOCK_DATA_TRANSFER;
    }
    if ((hash & 0b111000000001u) == 0b011000000001u) {
        return UNDEFINED;
    }
    if ((hash & 0b110000000000u) == 0b010000000000u) {
        return SINGLE_DATA_TRANSFER;
    }
    if ((hash & 0b111111111111u) == 0b000100100001u) {
        return BRANCH_EXCHANGE;
    }
    if ((hash & 0b111111001111u) == 0b000000001001u) {
        return MULTIPLY;
    }
    if ((hash & 0b111110001111u) == 0b000010001001u) {
        return MULTIPLY_LONG;
    }
    if ((hash & 0b111110111111u) == 0b000100001001u) {
        return SINGLE_DATA_SWAP;
    }

    if ((hash & 0b111000001001u) == 0b000000001001u) {
        byte opcode = (hash >> 1u) & 0b11u;

        if (opcode == 0b00){
            return UNDEFINED;
        }
        else if (hash & 0x40u) {
            return HALFWORD_DT_IO;
        }
        else {
            return HALFWORD_DT_RO;
        }
    }
    if ((hash & 0b110110010000u) == 0b000100000000u) {
        return STATUS_TRANSFER;
    }

    if ((hash & 0b110000000000u) == 0b000000000000u) {
        byte flags = (hash >> 4u) & 1u;
        byte opcode = (hash >> 5u) & 0b1111u;

        if ((opcode >> 2u) == 0b10 && !flags) {
            return UNDEFINED;
        }
        else {
            return DATA_PROCESSING;
        }
    }
    return UNDEFINED;
}